

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_multi_statemach(connectdata *conn,_Bool *done)

{
  CURLcode CVar1;
  CURLcode result;
  ftp_conn *ftpc;
  _Bool *done_local;
  connectdata *conn_local;
  
  CVar1 = Curl_pp_statemach(&(conn->proto).ftpc.pp,false);
  *done = (conn->proto).ftpc.state == FTP_STOP;
  return CVar1;
}

Assistant:

static CURLcode ftp_multi_statemach(struct connectdata *conn,
                                    bool *done)
{
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  CURLcode result = Curl_pp_statemach(&ftpc->pp, FALSE);

  /* Check for the state outside of the Curl_socket_ready() return code checks
     since at times we are in fact already in this state when this function
     gets called. */
  *done = (ftpc->state == FTP_STOP) ? TRUE : FALSE;

  return result;
}